

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

void __thiscall
so_5::disp::prio_dedicated_threads::one_per_prio::impl::proxy_dispatcher_t::do_actual_start
          (proxy_dispatcher_t *this,environment_t *env)

{
  environment_t *env_local;
  proxy_dispatcher_t *this_local;
  
  reuse::
  proxy_dispatcher_template_t<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t>
  ::
  make_actual_dispatcher<so_5::disp::prio_dedicated_threads::one_per_prio::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::no_activity_tracking_impl_t>>,so_5::disp::prio_dedicated_threads::one_per_prio::impl::dispatcher_template_t<so_5::disp::reuse::work_thread::details::work_thread_template_t<so_5::disp::reuse::work_thread::details::activity_tracking_impl_t>>,so_5::environment_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t&>
            ((proxy_dispatcher_template_t<so_5::disp::prio_dedicated_threads::one_per_prio::impl::actual_disp_iface_t,so_5::disp::prio_dedicated_threads::one_per_prio::disp_params_t>
              *)this,env,&(this->super_proxy_dispatcher_base_t).m_disp_params);
  return;
}

Assistant:

virtual void
		do_actual_start( environment_t & env ) override
			{
				using namespace so_5::disp::reuse::work_thread;

				using dispatcher_no_activity_tracking_t =
						dispatcher_template_t< work_thread_no_activity_tracking_t >;

				using dispatcher_with_activity_tracking_t =
						dispatcher_template_t<
								work_thread_with_activity_tracking_t >;

				make_actual_dispatcher<
							dispatcher_no_activity_tracking_t,
							dispatcher_with_activity_tracking_t >(
						env,
						m_disp_params );
			}